

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

void __thiscall
cfd::capi::CfdCapiManager::SetLastError
          (CfdCapiManager *this,void *handle,int error_code,char *message)

{
  size_t sVar1;
  string err_str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (handle != (void *)0x0) {
    memset((void *)((long)handle + 0x15),0,0x100);
    if (message != (char *)0x0) {
      sVar1 = strnlen(message,0x100);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,message,message + sVar1);
      std::__cxx11::string::copy((char *)local_50,(ulong)((long)handle + 0x15),0xff);
      *(undefined1 *)((long)handle + 0x114) = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    *(int *)((long)handle + 0x10) = error_code;
  }
  return;
}

Assistant:

void CfdCapiManager::SetLastError(
    void* handle, int error_code, const char* message) {
  if (handle != nullptr) {
    CfdCapiHandleData* data = static_cast<CfdCapiHandleData*>(handle);
    memset(data->error_message, 0, sizeof(data->error_message));
    if (message != nullptr) {
      std::string err_str(
          message, strnlen(message, sizeof(data->error_message)));
      err_str.copy(data->error_message, sizeof(data->error_message) - 1);
      data->error_message[sizeof(data->error_message) - 1] = '\0';
    }
    data->error_code = error_code;
  }
}